

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

void DumpBlock(void *b,size_t size,DumpState *D)

{
  lua_State *plVar1;
  int *piVar2;
  uint __line;
  int iVar3;
  char *__assertion;
  
  if ((size != 0) && (D->status == 0)) {
    plVar1 = D->L;
    piVar2 = *(int **)&plVar1[-1].hookmask;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      iVar3 = (*D->writer)(plVar1,b,size,D->data);
      D->status = iVar3;
      piVar2 = *(int **)&D->L[-1].hookmask;
      iVar3 = *piVar2;
      *piVar2 = iVar3 + 1;
      if (iVar3 == 0) {
        return;
      }
      __assertion = 
      "(*((struct L_EXTRA*)(((void *)((char *)(D->L) - sizeof(struct L_EXTRA)))))->plock)++ == 0";
      __line = 0x31;
    }
    else {
      __assertion = 
      "--(*((struct L_EXTRA*)(((void *)((char *)(D->L) - sizeof(struct L_EXTRA)))))->plock) == 0";
      __line = 0x2f;
    }
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldump.c"
                  ,__line,"void DumpBlock(const void *, size_t, DumpState *)");
  }
  return;
}

Assistant:

static void DumpBlock (const void *b, size_t size, DumpState *D) {
  if (D->status == 0 && size > 0) {
    lua_unlock(D->L);
    D->status = (*D->writer)(D->L, b, size, D->data);
    lua_lock(D->L);
  }
}